

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O3

bool __thiscall
google::protobuf::internal::ExtensionSet::ParseField
          (ExtensionSet *this,uint32 tag,CodedInputStream *input,Message *containing_type,
          UnknownFieldSet *unknown_fields)

{
  DescriptorPool *pDVar1;
  MessageFactory *pMVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  UnknownFieldSetFieldSkipper skipper;
  DescriptorPoolExtensionFinder finder;
  FieldSkipper local_58;
  UnknownFieldSet *local_50;
  ExtensionFinder local_48;
  DescriptorPool *local_40;
  MessageFactory *local_38;
  undefined8 local_30;
  
  local_58._vptr_FieldSkipper = (_func_int **)&PTR__FieldSkipper_0070df30;
  pDVar1 = input->extension_pool_;
  local_50 = unknown_fields;
  if (pDVar1 == (DescriptorPool *)0x0) {
    local_48._vptr_ExtensionFinder = (_func_int **)&PTR__ExtensionFinder_0070dfb8;
    local_40 = (DescriptorPool *)containing_type;
    bVar3 = ParseField(this,tag,input,&local_48,&local_58);
  }
  else {
    pMVar2 = input->extension_factory_;
    iVar4 = (*(containing_type->super_MessageLite)._vptr_MessageLite[0x17])(containing_type);
    local_30 = CONCAT44(extraout_var,iVar4);
    local_48._vptr_ExtensionFinder = (_func_int **)&PTR__ExtensionFinder_0070c9b0;
    local_40 = pDVar1;
    local_38 = pMVar2;
    bVar3 = ParseField(this,tag,input,&local_48,&local_58);
  }
  ExtensionFinder::~ExtensionFinder(&local_48);
  return bVar3;
}

Assistant:

bool ExtensionSet::ParseField(uint32 tag, io::CodedInputStream* input,
                              const Message* containing_type,
                              UnknownFieldSet* unknown_fields) {
  UnknownFieldSetFieldSkipper skipper(unknown_fields);
  if (input->GetExtensionPool() == NULL) {
    GeneratedExtensionFinder finder(containing_type);
    return ParseField(tag, input, &finder, &skipper);
  } else {
    DescriptorPoolExtensionFinder finder(input->GetExtensionPool(),
                                         input->GetExtensionFactory(),
                                         containing_type->GetDescriptor());
    return ParseField(tag, input, &finder, &skipper);
  }
}